

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::addTargetToInterface(CommonCore *this,ActionMessage *command)

{
  GlobalFederateId federateID;
  FederateStates FVar1;
  FederateState *pFVar2;
  BasicHandleInfo *hand;
  FilterFederate *this_00;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> lastData;
  ActionMessage pub;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> pStack_148;
  undefined1 local_e0 [32];
  Time local_c0;
  SmallBuffer local_a0;
  
  if (command->messageAction == cmd_add_filter) {
    this_00 = this->filterFed;
    if (this_00 == (FilterFederate *)0x0) {
      generateFilterFederate(this);
      this_00 = this->filterFed;
    }
    FilterFederate::processFilterInfo(this_00,command);
    if ((((command->source_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) &&
        ((this->super_BrokerBase).globalTime == false)) && ((command->flags & 0x10) == 0)) {
      pFVar2 = getFederateCore(this,(GlobalFederateId)(command->dest_id).gid);
      if (pFVar2 != (FederateState *)0x0) {
        ActionMessage::setAction(command,cmd_add_dependent);
        FederateState::addAction(pFVar2,command);
        return;
      }
    }
  }
  else {
    if ((command->dest_id).gid == (this->filterFedID)._M_i.gid) {
      FilterFederate::handleMessage(this->filterFed,command);
      return;
    }
    federateID.gid = (command->dest_id).gid;
    if (federateID.gid == (this->translatorFedID)._M_i.gid) {
      TranslatorFederate::handleMessage(this->translatorFed,command);
      return;
    }
    pFVar2 = getFederateCore(this,federateID);
    if (pFVar2 != (FederateState *)0x0) {
      if ((command->flags & 0x10) == 0) {
        FederateState::addAction(pFVar2,command);
      }
      hand = HandleManager::getHandleInfo(&this->loopHandles,(command->dest_handle).hid);
      if (hand != (BasicHandleInfo *)0x0) {
        setAsUsed(this,hand);
        if (command->messageAction == cmd_add_subscriber) {
          FVar1 = FederateState::getState(pFVar2);
          if (FVar1 != CREATED) {
            FederateState::getPublishedValue
                      (&pStack_148,pFVar2,(InterfaceHandle)(command->dest_handle).hid);
            if ((-0x7fffffffffffffff < pStack_148.second.internalTimeCode) &&
               (pStack_148.first.bufferSize != 0)) {
              ActionMessage::ActionMessage((ActionMessage *)local_e0,cmd_pub);
              local_e0._8_8_ = hand->handle;
              local_e0._16_4_ = (command->source_id).gid;
              local_e0._20_4_ = (command->source_handle).hid;
              SmallBuffer::operator=((SmallBuffer *)(local_e0 + 0x40),&pStack_148.first);
              local_c0.internalTimeCode = pStack_148.second.internalTimeCode;
              routeMessage(this,(ActionMessage *)local_e0);
              ActionMessage::~ActionMessage((ActionMessage *)local_e0);
            }
            if (((pStack_148.first.usingAllocatedBuffer == true) &&
                (pStack_148.first.nonOwning == false)) && (pStack_148.first.heap != (byte *)0x0)) {
              operator_delete__(pStack_148.first.heap);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::addTargetToInterface(ActionMessage& command)
{
    if (command.action() == CMD_ADD_FILTER) {
        if (filterFed == nullptr) {
            generateFilterFederate();
        }
        filterFed->processFilterInfo(command);
        if (command.source_id != global_broker_id_local) {
            if (!globalTime) {
                if (!checkActionFlag(command, error_flag)) {
                    auto* fed = getFederateCore(command.dest_id);
                    if (fed != nullptr) {
                        command.setAction(CMD_ADD_DEPENDENT);
                        fed->addAction(command);
                    }
                }
            }
        }
    } else if (command.dest_id == filterFedID) {
        // just forward these to the appropriate federate
        filterFed->handleMessage(command);
    } else if (command.dest_id == translatorFedID) {
        // just forward these to the appropriate federate
        translatorFed->handleMessage(command);
    } else {
        auto* fed = getFederateCore(command.dest_id);
        if (fed != nullptr) {
            if (!checkActionFlag(command, error_flag)) {
                fed->addAction(command);
            }
            auto* handle = loopHandles.getHandleInfo(command.dest_handle.baseValue());
            if (handle != nullptr) {
                setAsUsed(handle);
                if (command.action() == CMD_ADD_SUBSCRIBER &&
                    fed->getState() > FederateStates::CREATED) {
                    auto lastData = fed->getPublishedValue(command.dest_handle);
                    if (lastData.second > Time::minVal() && !lastData.first.empty()) {
                        ActionMessage pub(CMD_PUB);
                        pub.setSource(handle->handle);
                        pub.setDestination(command.getSource());
                        pub.payload = std::move(lastData.first);
                        pub.actionTime = lastData.second;
                        routeMessage(std::move(pub));
                    }
                }
            }
        }
    }
}